

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVoronoiSimplexSolver.cpp
# Opt level: O3

void __thiscall
btVoronoiSimplexSolver::addVertex
          (btVoronoiSimplexSolver *this,btVector3 *w,btVector3 *p,btVector3 *q)

{
  int iVar1;
  undefined8 uVar2;
  
  uVar2 = *(undefined8 *)(w->m_floats + 2);
  *(undefined8 *)(this->m_lastW).m_floats = *(undefined8 *)w->m_floats;
  *(undefined8 *)((this->m_lastW).m_floats + 2) = uVar2;
  this->m_needsUpdate = true;
  iVar1 = this->m_numVertices;
  uVar2 = *(undefined8 *)(w->m_floats + 2);
  *(undefined8 *)this->m_simplexVectorW[iVar1].m_floats = *(undefined8 *)w->m_floats;
  *(undefined8 *)(this->m_simplexVectorW[iVar1].m_floats + 2) = uVar2;
  iVar1 = this->m_numVertices;
  uVar2 = *(undefined8 *)(p->m_floats + 2);
  *(undefined8 *)this->m_simplexPointsP[iVar1].m_floats = *(undefined8 *)p->m_floats;
  *(undefined8 *)(this->m_simplexPointsP[iVar1].m_floats + 2) = uVar2;
  iVar1 = this->m_numVertices;
  uVar2 = *(undefined8 *)(q->m_floats + 2);
  *(undefined8 *)this->m_simplexPointsQ[iVar1].m_floats = *(undefined8 *)q->m_floats;
  *(undefined8 *)(this->m_simplexPointsQ[iVar1].m_floats + 2) = uVar2;
  this->m_numVertices = this->m_numVertices + 1;
  return;
}

Assistant:

void btVoronoiSimplexSolver::addVertex(const btVector3& w, const btVector3& p, const btVector3& q)
{
	m_lastW = w;
	m_needsUpdate = true;

	m_simplexVectorW[m_numVertices] = w;
	m_simplexPointsP[m_numVertices] = p;
	m_simplexPointsQ[m_numVertices] = q;

	m_numVertices++;
}